

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QCss::StyleSheet>::moveAppend
          (QGenericArrayOps<QCss::StyleSheet> *this,StyleSheet *b,StyleSheet *e)

{
  StyleSheet *pSVar1;
  Data *pDVar2;
  StyleRule *pSVar3;
  qsizetype qVar4;
  Data *pDVar5;
  MediaRule *pMVar6;
  Data *pDVar7;
  PageRule *pPVar8;
  Data *pDVar9;
  AnimationRule *pAVar10;
  Data *pDVar11;
  ImportRule *pIVar12;
  Data *pDVar13;
  int iVar14;
  qsizetype qVar15;
  
  if ((b != e) && (b < e)) {
    pSVar1 = (this->super_QArrayDataPointer<QCss::StyleSheet>).ptr;
    qVar15 = (this->super_QArrayDataPointer<QCss::StyleSheet>).size;
    do {
      pDVar2 = (b->styleRules).d.d;
      (b->styleRules).d.d = (Data *)0x0;
      pSVar1[qVar15].styleRules.d.d = pDVar2;
      pSVar3 = (b->styleRules).d.ptr;
      (b->styleRules).d.ptr = (StyleRule *)0x0;
      pSVar1[qVar15].styleRules.d.ptr = pSVar3;
      qVar4 = (b->styleRules).d.size;
      (b->styleRules).d.size = 0;
      pSVar1[qVar15].styleRules.d.size = qVar4;
      pDVar5 = (b->mediaRules).d.d;
      (b->mediaRules).d.d = (Data *)0x0;
      pSVar1[qVar15].mediaRules.d.d = pDVar5;
      pMVar6 = (b->mediaRules).d.ptr;
      (b->mediaRules).d.ptr = (MediaRule *)0x0;
      pSVar1[qVar15].mediaRules.d.ptr = pMVar6;
      qVar4 = (b->mediaRules).d.size;
      (b->mediaRules).d.size = 0;
      pSVar1[qVar15].mediaRules.d.size = qVar4;
      pDVar7 = (b->pageRules).d.d;
      (b->pageRules).d.d = (Data *)0x0;
      pSVar1[qVar15].pageRules.d.d = pDVar7;
      pPVar8 = (b->pageRules).d.ptr;
      (b->pageRules).d.ptr = (PageRule *)0x0;
      pSVar1[qVar15].pageRules.d.ptr = pPVar8;
      qVar4 = (b->pageRules).d.size;
      (b->pageRules).d.size = 0;
      pSVar1[qVar15].pageRules.d.size = qVar4;
      pDVar9 = (b->animationRules).d.d;
      (b->animationRules).d.d = (Data *)0x0;
      pSVar1[qVar15].animationRules.d.d = pDVar9;
      pAVar10 = (b->animationRules).d.ptr;
      (b->animationRules).d.ptr = (AnimationRule *)0x0;
      pSVar1[qVar15].animationRules.d.ptr = pAVar10;
      qVar4 = (b->animationRules).d.size;
      (b->animationRules).d.size = 0;
      pSVar1[qVar15].animationRules.d.size = qVar4;
      pDVar11 = (b->importRules).d.d;
      (b->importRules).d.d = (Data *)0x0;
      pSVar1[qVar15].importRules.d.d = pDVar11;
      pIVar12 = (b->importRules).d.ptr;
      (b->importRules).d.ptr = (ImportRule *)0x0;
      pSVar1[qVar15].importRules.d.ptr = pIVar12;
      qVar4 = (b->importRules).d.size;
      (b->importRules).d.size = 0;
      pSVar1[qVar15].importRules.d.size = qVar4;
      iVar14 = b->depth;
      pSVar1[qVar15].origin = b->origin;
      pSVar1[qVar15].depth = iVar14;
      pDVar13 = (b->nameIndex).d;
      (b->nameIndex).d = (Data *)0x0;
      pSVar1[qVar15].nameIndex.d = pDVar13;
      qVar4 = (b->nameIndex).m_size;
      (b->nameIndex).m_size = 0;
      pSVar1[qVar15].nameIndex.m_size = qVar4;
      pDVar13 = (b->idIndex).d;
      (b->idIndex).d = (Data *)0x0;
      pSVar1[qVar15].idIndex.d = pDVar13;
      qVar4 = (b->idIndex).m_size;
      (b->idIndex).m_size = 0;
      pSVar1[qVar15].idIndex.m_size = qVar4;
      b = b + 1;
      qVar15 = (this->super_QArrayDataPointer<QCss::StyleSheet>).size + 1;
      (this->super_QArrayDataPointer<QCss::StyleSheet>).size = qVar15;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }